

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kx.h
# Opt level: O1

int hydro_kx_xx_3(hydro_kx_state *state,hydro_kx_session_keypair *kp,uint8_t *packet3,
                 uint8_t *peer_static_pk,uint8_t *packet2,uint8_t *psk,hydro_kx_keypair *static_kp)

{
  uint8_t *sk;
  int iVar1;
  uint8_t *in_;
  uint8_t *m;
  uint8_t *packet3_enc_static_pk;
  uint8_t peer_static_pk_ [32];
  uint8_t local_58 [40];
  
  in_ = "";
  if (psk != (uint8_t *)0x0) {
    in_ = psk;
  }
  m = local_58;
  if (peer_static_pk != (uint8_t *)0x0) {
    m = peer_static_pk;
  }
  hydro_hash_update(&state->h_st,packet2,0x20);
  sk = (state->eph_kp).sk;
  iVar1 = hydro_kx_dh(state,sk,packet2);
  if ((((iVar1 == 0) && (iVar1 = hydro_kx_aead_decrypt(state,m,packet2 + 0x20,0x30), iVar1 == 0)) &&
      (iVar1 = hydro_kx_dh(state,sk,m), iVar1 == 0)) &&
     (iVar1 = hydro_kx_aead_decrypt(state,(uint8_t *)0x0,packet2 + 0x50,0x10), iVar1 == 0)) {
    hydro_kx_aead_encrypt(state,packet3,static_kp->pk,0x20);
    iVar1 = hydro_kx_dh(state,static_kp->sk,packet2);
    if (iVar1 == 0) {
      hydro_hash_update(&state->h_st,in_,0x20);
      hydro_kx_aead_encrypt(state,packet3 + 0x30,(uint8_t *)0x0,0);
      hydro_kx_final(state,kp->rx,kp->tx);
      return 0;
    }
    return -1;
  }
  return -1;
}

Assistant:

int
hydro_kx_xx_3(hydro_kx_state *state, hydro_kx_session_keypair *kp,
              uint8_t       packet3[hydro_kx_XX_PACKET3BYTES],
              uint8_t       peer_static_pk[hydro_kx_PUBLICKEYBYTES],
              const uint8_t packet2[hydro_kx_XX_PACKET2BYTES], const uint8_t psk[hydro_kx_PSKBYTES],
              const hydro_kx_keypair *static_kp)
{
    uint8_t        peer_static_pk_[hydro_kx_PUBLICKEYBYTES];
    const uint8_t *peer_eph_pk        = &packet2[0];
    const uint8_t *peer_enc_static_pk = &packet2[hydro_kx_PUBLICKEYBYTES];
    const uint8_t *packet2_mac =
        &packet2[hydro_kx_PUBLICKEYBYTES + hydro_kx_PUBLICKEYBYTES + hydro_kx_AEAD_MACBYTES];
    uint8_t *packet3_enc_static_pk = &packet3[0];
    uint8_t *packet3_mac           = &packet3[hydro_kx_PUBLICKEYBYTES + hydro_kx_AEAD_MACBYTES];

    if (psk == NULL) {
        psk = zero;
    }
    if (peer_static_pk == NULL) {
        peer_static_pk = peer_static_pk_;
    }
    hydro_hash_update(&state->h_st, peer_eph_pk, hydro_kx_PUBLICKEYBYTES);
    if (hydro_kx_dh(state, state->eph_kp.sk, peer_eph_pk) != 0 ||
        hydro_kx_aead_decrypt(state, peer_static_pk, peer_enc_static_pk,
                              hydro_kx_PUBLICKEYBYTES + hydro_kx_AEAD_MACBYTES) != 0 ||
        hydro_kx_dh(state, state->eph_kp.sk, peer_static_pk) != 0 ||
        hydro_kx_aead_decrypt(state, NULL, packet2_mac, hydro_kx_AEAD_MACBYTES) != 0) {
        return -1;
    }

    hydro_kx_aead_encrypt(state, packet3_enc_static_pk, static_kp->pk, sizeof static_kp->pk);
    if (hydro_kx_dh(state, static_kp->sk, peer_eph_pk) != 0) {
        return -1;
    }
    hydro_hash_update(&state->h_st, psk, hydro_kx_PSKBYTES);
    hydro_kx_aead_encrypt(state, packet3_mac, NULL, 0);
    hydro_kx_final(state, kp->rx, kp->tx);

    return 0;
}